

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

bool __thiscall llvm::yaml::Document::parseDirectives(Document *this)

{
  bool bVar1;
  Token *pTVar2;
  bool bVar3;
  Token T;
  Token local_60;
  
  bVar3 = false;
  do {
    pTVar2 = peekNext(this);
    Token::Token(&local_60,pTVar2);
    if (local_60.Kind == TK_VersionDirective) {
      parseYAMLDirective(this);
LAB_00176192:
      bVar3 = true;
      bVar1 = true;
    }
    else {
      if (local_60.Kind == TK_TagDirective) {
        parseTAGDirective(this);
        goto LAB_00176192;
      }
      bVar1 = false;
    }
    std::__cxx11::string::_M_dispose();
    if (!bVar1) {
      return bVar3;
    }
  } while( true );
}

Assistant:

bool Document::parseDirectives() {
  bool isDirective = false;
  while (true) {
    Token T = peekNext();
    if (T.Kind == Token::TK_TagDirective) {
      parseTAGDirective();
      isDirective = true;
    } else if (T.Kind == Token::TK_VersionDirective) {
      parseYAMLDirective();
      isDirective = true;
    } else
      break;
  }
  return isDirective;
}